

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_elements_transaction.cpp
# Opt level: O3

void __thiscall
cfdcapi_elements_transaction_AddMultisigSignConfidentialTxSimple_Test::TestBody
          (cfdcapi_elements_transaction_AddMultisigSignConfidentialTxSimple_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  Message local_80;
  int ret;
  AssertHelper local_70;
  char *signature;
  char *sighash;
  AssertionResult gtest_ar;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  void *handle;
  char *tx_string;
  void *multisign_handle;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  
  handle = (void *)0x0;
  ret = CfdCreateHandle(&handle);
  multisign_handle = (void *)((ulong)multisign_handle._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&multisign_handle,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&multisign_handle);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sighash,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x634,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&sighash,(Message *)&multisign_handle);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sighash);
    if (multisign_handle != (void *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (multisign_handle != (void *)0x0)) {
        (**(code **)(*multisign_handle + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  multisign_handle = (void *)CONCAT71(multisign_handle._1_7_,handle != (void *)0x0);
  local_20.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (handle == (void *)0x0) {
    testing::Message::Message((Message *)&sighash);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&multisign_handle,
               (AssertionResult *)"(NULL == handle)","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&signature,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x635,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&signature,(Message *)&sighash);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&signature);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != &local_48) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_),
                      local_48._M_allocated_capacity + 1);
    }
    if (sighash != (char *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (sighash != (char *)0x0)) {
        (**(code **)(*(long *)sighash + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  multisign_handle = (void *)0x0;
  ret = CfdInitializeMultisigSign(handle,&multisign_handle);
  sighash = (char *)((ulong)sighash._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&sighash,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&sighash);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&signature,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x639,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&signature,(Message *)&sighash);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&signature);
    if (sighash != (char *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (sighash != (char *)0x0)) {
        (**(code **)(*(long *)sighash + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (ret == 0) {
    sighash = (char *)0x0;
    signature = (char *)0x0;
    tx_string = (char *)0x0;
    ret = CfdCreateConfidentialSighash
                    (handle,
                     "0200000000020f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570000000000ffffffff0f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c346000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b947f6002200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d17a914ef3e40882e17d6e477082fcafeb0f09dc32d377b87010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b9270002cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a1976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000000000c350000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c3460003ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed8791976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac00000000"
                     ,"57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f",0,5,
                     (char *)0x0,
                     "522102bfd7daa5d113fcbd8c2f374ae58cbb89cbed9570e898f1af5ff989457e2d4d712102715ed9a5f16153c5216a6751b7d84eba32076f0b607550a58b209077ab7c30ad52ae"
                     ,13000000000000,(char *)0x0,1,false,&sighash);
    local_80.ss_.ptr_._0_4_ = 0;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&local_80,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message(&local_80);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x643,pcVar2);
      testing::internal::AssertHelper::operator=(&local_70,&local_80);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      if (CONCAT44(local_80.ss_.ptr_._4_4_,local_80.ss_.ptr_._0_4_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           ((long *)CONCAT44(local_80.ss_.ptr_._4_4_,local_80.ss_.ptr_._0_4_) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(local_80.ss_.ptr_._4_4_,local_80.ss_.ptr_._0_4_) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (ret == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&gtest_ar,
                 "\"d17f091203341a0d1f0101c6d010a40ce0f3cef8a09b2b605b77bb6cfc23359f\"","sighash",
                 "d17f091203341a0d1f0101c6d010a40ce0f3cef8a09b2b605b77bb6cfc23359f",sighash);
      if (gtest_ar.success_ == false) {
        testing::Message::Message(&local_80);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_70,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x645,pcVar2);
        testing::internal::AssertHelper::operator=(&local_70,&local_80);
        testing::internal::AssertHelper::~AssertHelper(&local_70);
        if (CONCAT44(local_80.ss_.ptr_._4_4_,local_80.ss_.ptr_._0_4_) != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             ((long *)CONCAT44(local_80.ss_.ptr_._4_4_,local_80.ss_.ptr_._0_4_) != (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(local_80.ss_.ptr_._4_4_,local_80.ss_.ptr_._0_4_) + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      ret = CfdCalculateEcSignature
                      (handle,sighash,(char *)0x0,
                       "cRVLMWHogUo51WECRykTbeLNbm5c57iEpSegjdxco3oef6o5dbFi",2,true,&signature);
      local_80.ss_.ptr_._0_4_ = 0;
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&local_80,&ret);
      if (gtest_ar.success_ == false) {
        testing::Message::Message(&local_80);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_70,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x649,pcVar2);
        testing::internal::AssertHelper::operator=(&local_70,&local_80);
        testing::internal::AssertHelper::~AssertHelper(&local_70);
        if (CONCAT44(local_80.ss_.ptr_._4_4_,local_80.ss_.ptr_._0_4_) != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             ((long *)CONCAT44(local_80.ss_.ptr_._4_4_,local_80.ss_.ptr_._0_4_) != (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(local_80.ss_.ptr_._4_4_,local_80.ss_.ptr_._0_4_) + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      if (ret == 0) {
        ret = CfdAddMultisigSignDataToDer
                        (handle,multisign_handle,signature,1,false,
                         "02715ed9a5f16153c5216a6751b7d84eba32076f0b607550a58b209077ab7c30ad");
        local_80.ss_.ptr_._0_4_ = 0;
        testing::internal::CmpHelperEQ<CfdErrorCode,int>
                  ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&local_80,&ret);
        if (gtest_ar.success_ == false) {
          testing::Message::Message(&local_80);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_70,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                     ,0x64d,pcVar2);
          testing::internal::AssertHelper::operator=(&local_70,&local_80);
          testing::internal::AssertHelper::~AssertHelper(&local_70);
          if (CONCAT44(local_80.ss_.ptr_._4_4_,local_80.ss_.ptr_._0_4_) != 0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) &&
               ((long *)CONCAT44(local_80.ss_.ptr_._4_4_,local_80.ss_.ptr_._0_4_) != (long *)0x0)) {
              (**(code **)(*(long *)CONCAT44(local_80.ss_.ptr_._4_4_,local_80.ss_.ptr_._0_4_) + 8))
                        ();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&gtest_ar.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        CfdFreeStringBuffer(signature);
        if (ret == 0) {
          ret = CfdCalculateEcSignature
                          (handle,sighash,(char *)0x0,
                           "cQUTZ8VbWNYBEtrB7xwe41kqiKMQPRZshTvBHmkoJGaUfmS5pxzR",2,true,&signature)
          ;
          local_80.ss_.ptr_._0_4_ = 0;
          testing::internal::CmpHelperEQ<CfdErrorCode,int>
                    ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&local_80,&ret);
          if (gtest_ar.success_ == false) {
            testing::Message::Message(&local_80);
            if (gtest_ar.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_70,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                       ,0x655,pcVar2);
            testing::internal::AssertHelper::operator=(&local_70,&local_80);
            testing::internal::AssertHelper::~AssertHelper(&local_70);
            if (CONCAT44(local_80.ss_.ptr_._4_4_,local_80.ss_.ptr_._0_4_) != 0) {
              bVar1 = testing::internal::IsTrue(true);
              if ((bVar1) &&
                 ((long *)CONCAT44(local_80.ss_.ptr_._4_4_,local_80.ss_.ptr_._0_4_) != (long *)0x0))
              {
                (**(code **)(*(long *)CONCAT44(local_80.ss_.ptr_._4_4_,local_80.ss_.ptr_._0_4_) + 8)
                )();
              }
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&gtest_ar.message_,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          if (ret == 0) {
            ret = CfdAddMultisigSignDataToDer
                            (handle,multisign_handle,signature,1,false,
                             "02bfd7daa5d113fcbd8c2f374ae58cbb89cbed9570e898f1af5ff989457e2d4d71");
            local_80.ss_.ptr_._0_4_ = 0;
            testing::internal::CmpHelperEQ<CfdErrorCode,int>
                      ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&local_80,&ret);
            if (gtest_ar.success_ == false) {
              testing::Message::Message(&local_80);
              if (gtest_ar.message_.ptr_ ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar2 = "";
              }
              else {
                pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_70,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                         ,0x659,pcVar2);
              testing::internal::AssertHelper::operator=(&local_70,&local_80);
              testing::internal::AssertHelper::~AssertHelper(&local_70);
              if (CONCAT44(local_80.ss_.ptr_._4_4_,local_80.ss_.ptr_._0_4_) != 0) {
                bVar1 = testing::internal::IsTrue(true);
                if ((bVar1) &&
                   ((long *)CONCAT44(local_80.ss_.ptr_._4_4_,local_80.ss_.ptr_._0_4_) != (long *)0x0
                   )) {
                  (**(code **)(*(long *)CONCAT44(local_80.ss_.ptr_._4_4_,local_80.ss_.ptr_._0_4_) +
                              8))();
                }
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&gtest_ar.message_,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            CfdFreeStringBuffer(signature);
            if (ret == 0) {
              ret = CfdFinalizeMultisigSign
                              (handle,multisign_handle,0xb,
                               "0200000000020f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570000000000ffffffff0f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c346000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b947f6002200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d17a914ef3e40882e17d6e477082fcafeb0f09dc32d377b87010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b9270002cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a1976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000000000c350000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c3460003ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed8791976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac00000000"
                               ,"57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f",0
                               ,5,
                               "522102bfd7daa5d113fcbd8c2f374ae58cbb89cbed9570e898f1af5ff989457e2d4d712102715ed9a5f16153c5216a6751b7d84eba32076f0b607550a58b209077ab7c30ad52ae"
                               ,&tx_string);
              local_80.ss_.ptr_._0_4_ = 0;
              testing::internal::CmpHelperEQ<CfdErrorCode,int>
                        ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&local_80,&ret);
              if (gtest_ar.success_ == false) {
                testing::Message::Message(&local_80);
                if (gtest_ar.message_.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar2 = "";
                }
                else {
                  pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_70,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                           ,0x662,pcVar2);
                testing::internal::AssertHelper::operator=(&local_70,&local_80);
                testing::internal::AssertHelper::~AssertHelper(&local_70);
                if (CONCAT44(local_80.ss_.ptr_._4_4_,local_80.ss_.ptr_._0_4_) != 0) {
                  bVar1 = testing::internal::IsTrue(true);
                  if ((bVar1) &&
                     ((long *)CONCAT44(local_80.ss_.ptr_._4_4_,local_80.ss_.ptr_._0_4_) !=
                      (long *)0x0)) {
                    (**(code **)(*(long *)CONCAT44(local_80.ss_.ptr_._4_4_,local_80.ss_.ptr_._0_4_)
                                + 8))();
                  }
                }
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset(&gtest_ar.message_,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              if (ret == 0) {
                testing::internal::CmpHelperSTREQ
                          ((internal *)&gtest_ar,
                           "\"0200000001020f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a15700000000232200206e67741009d105674a17f86e73433030eea0603c020fb25ea08c6fadd6c2f62dffffffff0f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c346000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b947f6002200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d17a914ef3e40882e17d6e477082fcafeb0f09dc32d377b87010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b9270002cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a1976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000000000c350000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c3460003ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed8791976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac00000000000004004730440220795dbf165d3197fe27e2b73d57cacfb8d742029c972b109040c7785aee4e75ea022065f7a985efe82eba1d0e0cafd7cf711bb8c65485bddc4e495315dd92bd7e4a790147304402202ce4acde192e4109832d46970b510158d42fc156c92afff137157ebfc2a03e2a02200b7dfd3a92770d79d29b3c55fb6325b22bce0e1362de74b2dac80d9689b5a89b0147522102bfd7daa5d113fcbd8c2f374ae58cbb89cbed9570e898f1af5ff989457e2d4d712102715ed9a5f16153c5216a6751b7d84eba32076f0b607550a58b209077ab7c30ad52ae00000000000000000000000000\""
                           ,"tx_string",
                           "0200000001020f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a15700000000232200206e67741009d105674a17f86e73433030eea0603c020fb25ea08c6fadd6c2f62dffffffff0f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c346000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b947f6002200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d17a914ef3e40882e17d6e477082fcafeb0f09dc32d377b87010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b9270002cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a1976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000000000c350000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c3460003ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed8791976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac00000000000004004730440220795dbf165d3197fe27e2b73d57cacfb8d742029c972b109040c7785aee4e75ea022065f7a985efe82eba1d0e0cafd7cf711bb8c65485bddc4e495315dd92bd7e4a790147304402202ce4acde192e4109832d46970b510158d42fc156c92afff137157ebfc2a03e2a02200b7dfd3a92770d79d29b3c55fb6325b22bce0e1362de74b2dac80d9689b5a89b0147522102bfd7daa5d113fcbd8c2f374ae58cbb89cbed9570e898f1af5ff989457e2d4d712102715ed9a5f16153c5216a6751b7d84eba32076f0b607550a58b209077ab7c30ad52ae00000000000000000000000000"
                           ,tx_string);
                if (gtest_ar.success_ == false) {
                  testing::Message::Message(&local_80);
                  if (gtest_ar.message_.ptr_ ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar2 = "";
                  }
                  else {
                    pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_70,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                             ,0x664,pcVar2);
                  testing::internal::AssertHelper::operator=(&local_70,&local_80);
                  testing::internal::AssertHelper::~AssertHelper(&local_70);
                  if (CONCAT44(local_80.ss_.ptr_._4_4_,local_80.ss_.ptr_._0_4_) != 0) {
                    bVar1 = testing::internal::IsTrue(true);
                    if ((bVar1) &&
                       ((long *)CONCAT44(local_80.ss_.ptr_._4_4_,local_80.ss_.ptr_._0_4_) !=
                        (long *)0x0)) {
                      (**(code **)(*(long *)CONCAT44(local_80.ss_.ptr_._4_4_,local_80.ss_.ptr_._0_4_
                                                    ) + 8))();
                    }
                  }
                }
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::reset(&gtest_ar.message_,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                CfdFreeStringBuffer(tx_string);
              }
            }
          }
        }
      }
    }
    CfdFreeStringBuffer(sighash);
    ret = CfdFreeMultisigSignHandle(handle,multisign_handle);
    local_80.ss_.ptr_._0_4_ = 0;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&local_80,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message(&local_80);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x66b,pcVar2);
      testing::internal::AssertHelper::operator=(&local_70,&local_80);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      if (CONCAT44(local_80.ss_.ptr_._4_4_,local_80.ss_.ptr_._0_4_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           ((long *)CONCAT44(local_80.ss_.ptr_._4_4_,local_80.ss_.ptr_._0_4_) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(local_80.ss_.ptr_._4_4_,local_80.ss_.ptr_._0_4_) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  ret = CfdGetLastErrorCode(handle);
  if (ret != 0) {
    sighash = (char *)0x0;
    ret = CfdGetLastErrorMessage(handle,&sighash);
    signature = (char *)((ulong)signature & 0xffffffff00000000);
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&signature,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&signature);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&tx_string,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x672,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&tx_string,(Message *)&signature);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tx_string);
      if (signature != (char *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (signature != (char *)0x0)) {
          (**(code **)(*(long *)signature + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    pcVar2 = "";
    testing::internal::CmpHelperSTREQ((internal *)&gtest_ar,"\"\"","str_buffer","",sighash);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&signature);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&tx_string,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x673,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&tx_string,(Message *)&signature);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tx_string);
      if (signature != (char *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (signature != (char *)0x0)) {
          (**(code **)(*(long *)signature + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    CfdFreeStringBuffer(sighash);
  }
  ret = CfdFreeHandle(handle);
  sighash = (char *)((ulong)sighash & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&sighash,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&sighash);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&signature,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x679,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&signature,(Message *)&sighash);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&signature);
    if (sighash != (char *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (sighash != (char *)0x0)) {
        (**(code **)(*(long *)sighash + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  return;
}

Assistant:

TEST(cfdcapi_elements_transaction, AddMultisigSignConfidentialTxSimple) {
  static const char* const kTxData = "0200000000020f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570000000000ffffffff0f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c346000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b947f6002200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d17a914ef3e40882e17d6e477082fcafeb0f09dc32d377b87010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b9270002cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a1976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000000000c350000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c3460003ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed8791976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac00000000";
  static const char* pubkey1 = "02715ed9a5f16153c5216a6751b7d84eba32076f0b607550a58b209077ab7c30ad";
  static const char* privkey1 = "cRVLMWHogUo51WECRykTbeLNbm5c57iEpSegjdxco3oef6o5dbFi";
  static const char* pubkey2 = "02bfd7daa5d113fcbd8c2f374ae58cbb89cbed9570e898f1af5ff989457e2d4d71";
  static const char* privkey2 = "cQUTZ8VbWNYBEtrB7xwe41kqiKMQPRZshTvBHmkoJGaUfmS5pxzR";
  static const char* multisig_script = "522102bfd7daa5d113fcbd8c2f374ae58cbb89cbed9570e898f1af5ff989457e2d4d712102715ed9a5f16153c5216a6751b7d84eba32076f0b607550a58b209077ab7c30ad52ae";

  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  void* multisign_handle = nullptr;
  ret = CfdInitializeMultisigSign(handle, &multisign_handle);
  EXPECT_EQ(kCfdSuccess, ret);

  if (ret == kCfdSuccess) {
    char* sighash = nullptr;
    int64_t satoshi = 13000000000000;
    char* signature = nullptr;
    char* tx_string = nullptr;
    ret = CfdCreateConfidentialSighash(
        handle, kTxData, "57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f", 0,
        kCfdP2shP2wsh, nullptr, multisig_script, satoshi, nullptr, kCfdSigHashAll, false, &sighash);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("d17f091203341a0d1f0101c6d010a40ce0f3cef8a09b2b605b77bb6cfc23359f", sighash);

      ret = CfdCalculateEcSignature(
        handle, sighash, nullptr, privkey1, kCfdNetworkRegtest, true, &signature);
      EXPECT_EQ(kCfdSuccess, ret);
      if (ret == kCfdSuccess) {
        ret = CfdAddMultisigSignDataToDer(
          handle, multisign_handle, signature, kCfdSigHashAll, false, pubkey1);
        EXPECT_EQ(kCfdSuccess, ret);
        CfdFreeStringBuffer(signature);
      }
    }

    if (ret == kCfdSuccess) {
      ret = CfdCalculateEcSignature(
        handle, sighash, nullptr, privkey2, kCfdNetworkRegtest, true, &signature);
      EXPECT_EQ(kCfdSuccess, ret);
      if (ret == kCfdSuccess) {
        ret = CfdAddMultisigSignDataToDer(
          handle, multisign_handle, signature, kCfdSigHashAll, false, pubkey2);
        EXPECT_EQ(kCfdSuccess, ret);
        CfdFreeStringBuffer(signature);
      }
    }
    if (ret == kCfdSuccess) {
      ret = CfdFinalizeMultisigSign(
          handle, multisign_handle, kCfdNetworkElementsRegtest, kTxData,
          "57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f", 0,
          kCfdP2shP2wsh, multisig_script, &tx_string);
      EXPECT_EQ(kCfdSuccess, ret);
      if (ret == kCfdSuccess) {
        EXPECT_STREQ("0200000001020f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a15700000000232200206e67741009d105674a17f86e73433030eea0603c020fb25ea08c6fadd6c2f62dffffffff0f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c346000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b947f6002200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d17a914ef3e40882e17d6e477082fcafeb0f09dc32d377b87010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b9270002cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a1976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000000000c350000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c3460003ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed8791976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac00000000000004004730440220795dbf165d3197fe27e2b73d57cacfb8d742029c972b109040c7785aee4e75ea022065f7a985efe82eba1d0e0cafd7cf711bb8c65485bddc4e495315dd92bd7e4a790147304402202ce4acde192e4109832d46970b510158d42fc156c92afff137157ebfc2a03e2a02200b7dfd3a92770d79d29b3c55fb6325b22bce0e1362de74b2dac80d9689b5a89b0147522102bfd7daa5d113fcbd8c2f374ae58cbb89cbed9570e898f1af5ff989457e2d4d712102715ed9a5f16153c5216a6751b7d84eba32076f0b607550a58b209077ab7c30ad52ae00000000000000000000000000", tx_string);
        CfdFreeStringBuffer(tx_string);
      }
    }
    CfdFreeStringBuffer(sighash);

    ret = CfdFreeMultisigSignHandle(handle, multisign_handle);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}